

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseAllResolveElementFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseAllResolveElementFunctionInfo *capabilityInfo1;
  SnapPromiseAllResolveElementFunctionInfo *capabilityInfo2;
  SnapPromiseAllResolveElementFunctionInfo *aInfo2;
  SnapPromiseAllResolveElementFunctionInfo *aInfo1;
  TTDCompareMap *compareMap_local;
  SnapObject *sobj2_local;
  SnapObject *sobj1_local;
  
  capabilityInfo1 =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
                 (sobj1);
  capabilityInfo2 =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
                 (sobj2);
  NSSnapValues::AssertSnapEquiv
            (&capabilityInfo1->Capabilities,&capabilityInfo2->Capabilities,compareMap);
  TTDCompareMap::DiagnosticAssert(compareMap,capabilityInfo1->Index == capabilityInfo2->Index);
  TTDCompareMap::DiagnosticAssert
            (compareMap,
             capabilityInfo1->RemainingElementsValue == capabilityInfo2->RemainingElementsValue);
  TTDCompareMap::DiagnosticAssert
            (compareMap,
             (capabilityInfo1->AlreadyCalled & 1U) == (capabilityInfo2->AlreadyCalled & 1U));
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
            (compareMap,capabilityInfo1->Values,capabilityInfo2->Values,L"values");
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,capabilityInfo1->RemainingElementsWrapperId,
             capabilityInfo2->RemainingElementsWrapperId);
  return;
}

Assistant:

void AssertSnapEquiv_SnapPromiseAllResolveElementFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            SnapPromiseAllResolveElementFunctionInfo* aInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(sobj1);
            SnapPromiseAllResolveElementFunctionInfo* aInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(sobj2);

            NSSnapValues::AssertSnapEquiv(&aInfo1->Capabilities, &aInfo2->Capabilities, compareMap);

            compareMap.DiagnosticAssert(aInfo1->Index == aInfo2->Index);
            compareMap.DiagnosticAssert(aInfo1->RemainingElementsValue == aInfo2->RemainingElementsValue);
            compareMap.DiagnosticAssert(aInfo1->AlreadyCalled == aInfo2->AlreadyCalled);

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(aInfo1->Values, aInfo2->Values, _u("values"));

            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(aInfo1->RemainingElementsWrapperId, aInfo2->RemainingElementsWrapperId);
        }